

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastMtR2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  ParseContext *table_00;
  bool bVar5;
  uint uVar6;
  ParseContext *field;
  MessageLite *pMVar7;
  ulong uVar8;
  Nonnull<const_char_*> failure_msg;
  char *pcVar9;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar10;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar11;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  MessageLite *unaff_RBX;
  ParseContext *ptr_00;
  uint *puVar12;
  ulong unaff_R13;
  ParseContext *pPVar13;
  pair<const_char_*,_int> pVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ParseContext *local_70 [2];
  char *local_60;
  MessageLite *local_58;
  
  if (data.field_0._0_2_ != 0) {
    pcVar9 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar9;
  }
  field = (ParseContext *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)field & 7) != 0) {
    AlignFail(field);
  }
  uVar2 = *(ushort *)ptr;
  table_00 = *(ParseContext **)
              ((long)&table->has_bits_offset +
              ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  local_60 = (char *)hasbits;
  local_58 = msg;
  do {
    ptr_00 = field;
    pMVar7 = AddMessage((TcParseTableBase *)table_00,(RepeatedPtrFieldBase *)field);
    bVar1 = *(byte *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_ + 2);
    aVar10.data._1_7_ = 0;
    aVar10.data._0_1_ = bVar1;
    if ((char)bVar1 < '\0') {
      ptr_00 = (ParseContext *)(ulong)(uint)bVar1;
      pVar14 = ReadSizeFallback((char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).
                                                limit_end_ + 2),(uint)bVar1);
      aVar10.data = pVar14._8_8_ & 0xffffffff;
    }
    else {
      pVar14._8_8_ = extraout_RDX;
      pVar14.first = (char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_ +
                             3);
    }
    uVar11 = pVar14._8_8_;
    pPVar13 = (ParseContext *)pVar14.first;
    if ((pPVar13 == (ParseContext *)0x0) || (ctx->depth_ < 1)) {
      pPVar13 = (ParseContext *)0x0;
    }
    else {
      ptr_00 = ctx;
      EpsCopyInputStream::PushLimit((EpsCopyInputStream *)local_70,(char *)ctx,(int)pVar14.first);
      unaff_R13 = (ulong)local_70[0] & 0xffffffff;
      ctx->depth_ = ctx->depth_ + -1;
      uVar11 = extraout_RDX_00;
    }
    auVar15._8_8_ = uVar11;
    auVar15._0_8_ = local_70[0];
    if (pPVar13 == (ParseContext *)0x0) {
LAB_002c3c5e:
      ptr = (char *)0x0;
    }
    else {
      iVar4 = ctx->depth_;
      local_70[0] = pPVar13;
      while( true ) {
        ptr_00 = (ParseContext *)local_70;
        bVar5 = EpsCopyInputStream::DoneWithCheck<false>
                          (&ctx->super_EpsCopyInputStream,(char **)local_70,ctx->group_depth_);
        auVar15._8_8_ = extraout_RDX_01;
        auVar15._0_8_ = local_70[0];
        if (bVar5) break;
        uVar3 = *(ushort *)&(local_70[0]->super_EpsCopyInputStream).limit_end_;
        uVar6 = (uint)*(byte *)&(table_00->super_EpsCopyInputStream).buffer_end_ & (uint)uVar3;
        if ((uVar6 & 7) != 0) goto LAB_002c3d7e;
        uVar8 = (ulong)(uVar6 & 0xfffffff8);
        aVar10.data = (ulong)uVar3 ^
                      *(ulong *)((table_00->super_EpsCopyInputStream).patch_buffer_ +
                                uVar8 * 2 + 0x18);
        auVar15 = (**(code **)((table_00->super_EpsCopyInputStream).patch_buffer_ + uVar8 * 2 + 0x10
                              ))(pMVar7,local_70[0],ctx,aVar10.data,table_00,0);
        ptr_00 = local_70[0];
        if ((auVar15._0_8_ == (ParseContext *)0x0) ||
           (local_70[0] = auVar15._0_8_, (ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0))
        break;
      }
      local_70[0] = auVar15._0_8_;
      if (((ulong)(table_00->super_EpsCopyInputStream).buffer_end_ & 0x100) == 0) {
        ptr = (char *)local_70[0];
        if (local_70[0] == (ParseContext *)0x0) {
          ptr_00 = table_00;
          VerifyHasBitConsistency(unaff_RBX,table);
          auVar15._8_8_ = extraout_RDX_02;
          auVar15._0_8_ = local_70[0];
          ptr = (char *)local_70[0];
        }
      }
      else {
        ptr_00 = local_70[0];
        auVar16 = (**(code **)(table_00->super_EpsCopyInputStream).patch_buffer_)
                            (pMVar7,local_70[0],ctx);
        auVar15._8_8_ = auVar16._8_8_;
        auVar15._0_8_ = local_70[0];
        ptr = (char *)auVar16._0_8_;
      }
      local_70[0] = auVar15._0_8_;
      if ((ParseContext *)ptr != (ParseContext *)0x0) {
        ptr_00 = (ParseContext *)(long)ctx->depth_;
        if (iVar4 == ctx->depth_) {
          failure_msg = (Nonnull<const_char_*>)0x0;
        }
        else {
          failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                  ((long)iVar4,(long)ptr_00,"old_depth == depth_");
          auVar15._8_8_ = extraout_RDX_03;
          auVar15._0_8_ = local_70[0];
        }
        local_70[0] = auVar15._0_8_;
        if (failure_msg != (Nonnull<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_70,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                     ,0x481,failure_msg);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)local_70);
        }
      }
      ctx->depth_ = ctx->depth_ + 1;
      uVar6 = (ctx->super_EpsCopyInputStream).limit_ + (int)unaff_R13;
      (ctx->super_EpsCopyInputStream).limit_ = uVar6;
      if ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0) goto LAB_002c3c5e;
      aVar10._0_4_ = (int)uVar6 >> 0x1f & uVar6;
      aVar10.data._4_4_ = 0;
      (ctx->super_EpsCopyInputStream).limit_end_ =
           (ctx->super_EpsCopyInputStream).buffer_end_ + (int)aVar10._0_4_;
    }
    local_70[0] = auVar15._0_8_;
    if ((ParseContext *)ptr == (ParseContext *)0x0) {
      pcVar9 = Error(local_58,(char *)ptr_00,auVar15._8_8_,(TcFieldData)aVar10,table,
                     (uint64_t)local_60);
      return pcVar9;
    }
    if ((ParseContext *)(ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar12 = (uint *)((long)&local_58->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar12 & 3) != 0) {
          AlignFail();
        }
        *puVar12 = *puVar12 | (uint)local_60;
      }
      return (char *)(ParseContext *)ptr;
    }
    uVar3 = *(ushort *)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_;
    if (uVar3 != uVar2) {
      uVar6 = (uint)table->fast_idx_mask & (uint)uVar3;
      if ((uVar6 & 7) == 0) {
        uVar8 = (ulong)(uVar6 & 0xfffffff8);
        pcVar9 = (char *)(**(code **)(&table[1].has_bits_offset + uVar8))
                                   (local_58,ptr,ctx,
                                    (ulong)uVar3 ^ *(ulong *)(&table[1].fast_idx_mask + uVar8 * 2),
                                    table,local_60);
        return pcVar9;
      }
LAB_002c3d7e:
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastMtR2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedParseMessageAuxImpl<uint16_t, false, true>(
      PROTOBUF_TC_PARAM_PASS);
}